

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Obj_t * Gia_ManEquivRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (fUseAll == 0) {
    uVar1 = (uint)p->pReprs[iVar2] >> 0x1c & 1;
  }
  else {
    uVar1 = ~(uint)p->pReprs[iVar2] & 0xfffffff;
  }
  if (uVar1 == 0) {
    return (Gia_Obj_t *)0x0;
  }
  if (fDualOut != 0) {
    iVar2 = Gia_ObjId(p,pObj);
    iVar3 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjDiffColors2(p,iVar2,(uint)p->pReprs[iVar3] & 0xfffffff);
    if (iVar2 == 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  iVar2 = Gia_ObjId(p,pObj);
  pGVar4 = Gia_ManObj(p,(uint)p->pReprs[iVar2] & 0xfffffff);
  return pGVar4;
}

Assistant:

static inline Gia_Obj_t * Gia_ManEquivRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    if ( fUseAll )
    {
        if ( Gia_ObjRepr(p, Gia_ObjId(p,pObj)) == GIA_VOID )
            return NULL;
    }
    else
    {
        if ( !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
            return NULL;
    }
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
        return NULL;
    return Gia_ManObj( p, Gia_ObjRepr(p, Gia_ObjId(p,pObj)) );
}